

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<true>>
           *this,long *state,long *next)

{
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<true>>
  sVar1;
  ushort uVar2;
  uint uVar3;
  byte *pbVar4;
  char cVar5;
  byte *pbVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  pbVar4 = (byte *)*state;
  uVar3 = *(uint *)(this + 8);
  pbVar6 = pbVar4;
  if (uVar3 == 0) {
    uVar9 = 0;
  }
  else {
    sVar1 = *this;
    uVar2 = *(ushort *)(this + 2);
    uVar8 = 0;
    do {
      if (pbVar6 == (byte *)state[4]) {
        *(undefined1 *)((long)state + 0x31) = 1;
        uVar9 = (int)(byte *)state[4] - (int)pbVar4;
        break;
      }
      uVar9 = uVar8;
      if (sVar1 == (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<true>>
                    )((*(ushort *)(state[10] + 0x10 + (ulong)*pbVar6 * 2) & uVar2) != 0)) break;
      pbVar6 = pbVar6 + 1;
      *state = (long)pbVar6;
      uVar8 = uVar8 + 1;
      uVar9 = uVar3;
    } while (uVar3 != uVar8);
  }
  if (this[0x18] ==
      (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<true>>
       )0x1) {
    if (*(uint *)(this + 8) <= uVar9) {
      pbVar6 = pbVar4 + ((byte *)state[4] != pbVar4);
    }
    if (uVar9 == 0) {
      pbVar6 = pbVar4 + ((byte *)state[4] != pbVar4);
    }
    state[0x12] = (long)pbVar6;
  }
  if (uVar9 < *(uint *)(this + 4)) {
LAB_0013435f:
    *state = (long)pbVar4;
    bVar7 = false;
  }
  else {
    cVar5 = (**(code **)(*next + 0x10))(next,state);
    bVar7 = true;
    if (cVar5 == '\0') {
      iVar10 = uVar9 + 1;
      do {
        iVar10 = iVar10 + -1;
        if (iVar10 == *(int *)(this + 4)) goto LAB_0013435f;
        *state = *state + -1;
        cVar5 = (**(code **)(*next + 0x10))(next,state);
      } while (cVar5 == '\0');
    }
  }
  return bVar7;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_slow_tag) const
        {
            int const diff = -static_cast<int>(Xpr::width == unknown_width::value ? this->width_ : Xpr::width);
            unsigned int matches = 0;
            BidiIter const tmp = state.cur_;

            // greedily match as much as we can
            while(matches < this->max_ && this->xpr_.match(state))
            {
                ++matches;
            }

            // If this repeater is at the front of the pattern, note
            // how much of the input we consumed so that a repeated search
            // doesn't have to cover the same ground again.
            if(this->leading_)
            {
                state.next_search_ = (matches && matches < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            if(this->min_ > matches)
            {
                state.cur_ = tmp;
                return false;
            }

            // try matching the rest of the pattern, and back off if necessary
            for(; ; --matches, std::advance(state.cur_, diff))
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(this->min_ == matches)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }